

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O3

void __thiscall Shell::Options::set(Options *this,char *name,char *value,bool longOpt)

{
  char *pcVar1;
  bool bVar2;
  IgnoreMissing IVar3;
  UserErrorException *this_00;
  ostream *poVar4;
  byte in_CL;
  byte bVar5;
  char *in_RDX;
  byte bVar6;
  char *in_RSI;
  Options *in_RDI;
  Iterator sit;
  string msg;
  string first;
  ValueNotFoundException *anon_var_0;
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sim;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd58;
  byte bVar7;
  byte bVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  byte bVar11;
  byte bVar12;
  undefined1 uVar13;
  byte bVar14;
  byte bVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  byte bVar18;
  byte bVar19;
  undefined1 uVar20;
  string *in_stack_fffffffffffffd68;
  allocator<char> local_286;
  allocator<char> local_285;
  allocator<char> local_284;
  allocator<char> local_283;
  allocator<char> local_282;
  allocator<char> local_281;
  char *local_280;
  char *local_270;
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [96];
  string local_c8 [32];
  string local_a8 [96];
  string local_48;
  
  bVar5 = in_CL & 1;
  uVar20 = 0;
  bVar19 = 0;
  bVar18 = 0;
  uVar17 = 0;
  uVar16 = 0;
  bVar15 = 0;
  bVar14 = 0;
  uVar13 = 0;
  bVar12 = 0;
  bVar11 = 0;
  uVar10 = 0;
  uVar9 = 0;
  bVar8 = 0;
  bVar7 = 0;
  local_280 = in_RSI;
  local_270 = in_RDX;
  if (bVar5 != 0) {
    uVar20 = 1;
    std::allocator<char>::allocator();
    bVar19 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_128,in_RSI,&local_283);
    bVar18 = 1;
    LookupWrapper::findLong
              ((LookupWrapper *)
               CONCAT17(bVar5,CONCAT16(uVar20,CONCAT15(bVar19,CONCAT14(1,CONCAT13(uVar17,CONCAT12(
                                                  uVar16,CONCAT11(bVar15,bVar14))))))),
               in_stack_fffffffffffffd68);
    pcVar1 = local_270;
    uVar17 = 1;
    uVar16 = 1;
    std::allocator<char>::allocator();
    bVar15 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_148,pcVar1,&local_284);
    bVar14 = 1;
    bVar2 = AbstractOptionValue::set
                      ((AbstractOptionValue *)
                       CONCAT17(uVar13,CONCAT16(bVar12,CONCAT15(bVar11,CONCAT14(uVar10,CONCAT13(
                                                  uVar9,CONCAT12(bVar8,CONCAT11(bVar7,
                                                  in_stack_fffffffffffffd58))))))),
                       in_stack_fffffffffffffd50,(bool)in_stack_fffffffffffffd4f);
    bVar6 = 1;
    if (!bVar2) goto LAB_00737396;
  }
  pcVar1 = local_280;
  bVar6 = 0;
  if ((bVar5 & 1) == 0) {
    uVar13 = 1;
    std::allocator<char>::allocator();
    bVar12 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_168,pcVar1,&local_285);
    bVar11 = 1;
    LookupWrapper::findShort
              ((LookupWrapper *)
               CONCAT17(bVar5,CONCAT16(uVar20,CONCAT15(bVar19,CONCAT14(bVar18,CONCAT13(uVar17,
                                                  CONCAT12(uVar16,CONCAT11(bVar15,bVar14))))))),
               in_stack_fffffffffffffd68);
    pcVar1 = local_270;
    uVar10 = 1;
    uVar9 = 1;
    std::allocator<char>::allocator();
    bVar8 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_188,pcVar1,&local_286);
    bVar7 = 1;
    bVar2 = AbstractOptionValue::set
                      ((AbstractOptionValue *)
                       CONCAT17(uVar13,CONCAT16(bVar12,CONCAT15(bVar11,CONCAT14(uVar10,CONCAT13(
                                                  uVar9,CONCAT12(bVar8,CONCAT11(1,
                                                  in_stack_fffffffffffffd58))))))),
                       in_stack_fffffffffffffd50,(bool)in_stack_fffffffffffffd4f);
    bVar6 = bVar2 ^ 0xff;
  }
LAB_00737396:
  if ((bVar7 & 1) != 0) {
    std::__cxx11::string::~string(local_188);
  }
  if ((bVar8 & 1) != 0) {
    std::allocator<char>::~allocator(&local_286);
  }
  if ((bVar11 & 1) != 0) {
    std::__cxx11::string::~string(local_168);
  }
  if ((bVar12 & 1) != 0) {
    std::allocator<char>::~allocator(&local_285);
  }
  if ((bVar14 & 1) != 0) {
    std::__cxx11::string::~string(local_148);
  }
  if ((bVar15 & 1) != 0) {
    std::allocator<char>::~allocator(&local_284);
  }
  if ((bVar18 & 1) != 0) {
    std::__cxx11::string::~string(local_128);
  }
  if ((bVar19 & 1) != 0) {
    std::allocator<char>::~allocator(&local_283);
  }
  if ((bVar6 & 1) != 0) {
    IVar3 = ignoreMissing(in_RDI);
    if (IVar3 == OFF) {
      this_00 = (UserErrorException *)__cxa_allocate_exception(0x50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_a8,local_270,&local_281);
      std::operator+(in_stack_fffffffffffffd50,
                     (char *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_c8,local_280,&local_282);
      std::operator+(in_stack_fffffffffffffd50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
      std::operator+(in_stack_fffffffffffffd50,
                     (char *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
      Lib::UserErrorException::Exception(this_00,&local_48);
      __cxa_throw(this_00,&Lib::UserErrorException::typeinfo,
                  Lib::UserErrorException::~UserErrorException);
    }
    if ((IVar3 == WARN) && (bVar2 = outputAllowed(false), bVar2)) {
      addCommentSignForSZS((ostream *)&std::cout);
      poVar4 = std::operator<<((ostream *)&std::cout,"% WARNING: invalid value ");
      poVar4 = std::operator<<(poVar4,local_270);
      poVar4 = std::operator<<(poVar4," for option ");
      poVar4 = std::operator<<(poVar4,local_280);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void Options::set(const char* name,const char* value, bool longOpt)
{
  try {
    if((longOpt && !_lookup.findLong(name)->set(value)) ||
        (!longOpt && !_lookup.findShort(name)->set(value))) {
      switch (ignoreMissing()) {
      case IgnoreMissing::OFF:
        USER_ERROR((std::string) value +" is an invalid value for "+(std::string)name+"\nSee help or use explain i.e. vampire -explain mode");
        break;
      case IgnoreMissing::WARN:
        if (outputAllowed()) {
          addCommentSignForSZS(std::cout);
          std::cout << "% WARNING: invalid value "<< value << " for option " << name << endl;
        }
        break;
      case IgnoreMissing::ON:
        break;
      }
    }
  }
  catch (const ValueNotFoundException&) {
    if (_ignoreMissing.actualValue != IgnoreMissing::ON) {
      std::string msg = (std::string)name + (longOpt ? " is not a valid option" : " is not a valid short option (did you mean --?)");
      if (_ignoreMissing.actualValue == IgnoreMissing::WARN) {
        if (outputAllowed()) {
          addCommentSignForSZS(std::cout);
          std::cout << "% WARNING: " << msg << endl;
        }
        return;
      } // else:
      Stack<std::string> sim = getSimilarOptionNames(name,false);
      Stack<std::string>::Iterator sit(sim);
      if(sit.hasNext()){
        std::string first = sit.next();
        msg += "\n\tMaybe you meant ";
        if(sit.hasNext()) msg += "one of:\n\t\t";
        msg += first;
        while(sit.hasNext()){ msg+="\n\t\t"+sit.next();}
        msg+="\n\tYou can use -explain <option> to explain an option";
      }
      USER_ERROR(msg);
    }
  }
}